

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O2

_Bool pyramid_isWon(Board *board)

{
  Spot *pSVar1;
  uchar spotIndex;
  
  spotIndex = '\0';
  do {
    if (spotIndex == '\x1c') {
      if (((gConfig.game)->id & ~BAKERSGAME) == PYRAMIDRELAXED) {
        return true;
      }
      pSVar1 = board_spotGet(board,FOUNDATION,'\0');
      return pSVar1->cardsCount == '4';
    }
    pSVar1 = board_spotGet(board,TABLEAU,spotIndex);
    spotIndex = spotIndex + '\x01';
  } while (pSVar1->cardsCount == '\0');
  return false;
}

Assistant:

bool pyramid_isWon(Board * board)
{
	unsigned char i;
	for(i=0;i<28;i++)
	{
		if(board_spotGet(board, TABLEAU, i)->cardsCount!=0)
			return false;
	}

	if(gConfig.game->id==PYRAMIDRELAXED || gConfig.game->id==PYRAMIDRELAXEDEASY)
		return true;

	return board_spotGet(board, FOUNDATION, 0)->cardsCount==52;
}